

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::neg(Literal *__return_storage_ptr__,Literal *this)

{
  uint uVar1;
  Literal *ret;
  anon_union_16_5_9943fe1e_for_Literal_0 local_28;
  undefined8 local_18;
  
  switch((this->type).id) {
  case 0:
  case 1:
  case 6:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x35a);
  case 2:
    (__return_storage_ptr__->field_0).i32 = -(this->field_0).i32;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  case 3:
    (__return_storage_ptr__->field_0).i64 = -(this->field_0).i64;
    (__return_storage_ptr__->type).id = 3;
    return __return_storage_ptr__;
  case 4:
    uVar1 = (this->field_0).i32;
    local_28.func.super_IString.str._M_len = CONCAT44(local_28.i64._4_4_,uVar1) ^ 0x80000000;
    local_18 = 2;
    (__return_storage_ptr__->type).id = 4;
    (__return_storage_ptr__->field_0).i32 = uVar1 ^ 0x80000000;
    break;
  case 5:
    local_28.func.super_IString.str._M_len =
         (this->field_0).func.super_IString.str._M_len ^ 0x8000000000000000;
    local_18 = 3;
    (__return_storage_ptr__->type).id = 5;
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len = local_28.i64;
    break;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  ~Literal((Literal *)&local_28.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::neg() const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(-uint32_t(i32));
    case Type::i64:
      return Literal(-uint64_t(i64));
    case Type::f32:
      return Literal(i32 ^ 0x80000000).castToF32();
    case Type::f64:
      return Literal(int64_t(i64 ^ 0x8000000000000000ULL)).castToF64();
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}